

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

raw_problem_status read_quadratic_element(stream_buffer *buf,problem_parser *p,double sign_factor)

{
  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  *this;
  size_t sVar1;
  objective_quadratic_element *poVar2;
  pointer poVar3;
  string_view buf_1;
  string_view value;
  string_view value_00;
  string_view value_01;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  pointer poVar9;
  __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
  _Var10;
  pointer poVar11;
  long lVar12;
  long lVar13;
  __normal_iterator<baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
  __it;
  raw_problem_status rVar14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __x;
  ulong local_98;
  undefined8 local_70;
  optional<function_element_token> fct_opt;
  
  __y._M_str = "[";
  __y._M_len = 1;
  bVar5 = std::operator==((buf->buffer_ptr)._M_elems[0],__y);
  local_98 = 7;
  if (bVar5) {
    stream_buffer::pop_front(buf);
    this = &(p->m_problem).objective.qelements;
LAB_00129817:
    while ((sVar1 = (buf->buffer_ptr)._M_elems[0]._M_len, sVar1 != 0 &&
           (__y_00._M_str = "]", __y_00._M_len = 1,
           __x._M_str = (buf->buffer_ptr)._M_elems[0]._M_str, __x._M_len = sVar1,
           bVar5 = std::operator==(__x,__y_00), !bVar5))) {
      buf_1._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      buf_1._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      read_quadratic_element
                (&fct_opt,buf_1,(buf->buffer_ptr)._M_elems[1],(buf->buffer_ptr)._M_elems[2]);
      uVar4 = fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
              super__Optional_payload_base<function_element_token>._M_payload._M_value.factor;
      if (fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
          super__Optional_payload_base<function_element_token>._M_engaged == false)
      goto LAB_00129d2e;
      value_01._M_str._0_1_ =
           fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_payload._16_1_;
      value_01._M_len =
           fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_payload._M_value.name._M_len;
      value_01._M_str._1_7_ =
           fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_payload._17_7_;
      value_00._M_str._0_1_ =
           fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_payload._16_1_;
      value_00._M_len =
           fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_payload._M_value.name._M_len;
      value_00._M_str._1_7_ =
           fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_payload._17_7_;
      stream_buffer::pop_front
                (buf,fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
                     super__Optional_payload_base<function_element_token>._M_payload._M_value.read);
      __y_01._M_str = "*";
      __y_01._M_len = 1;
      bVar5 = std::operator==((buf->buffer_ptr)._M_elems[0],__y_01);
      if (!bVar5) goto LAB_001299be;
      read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&fct_opt,
                (buf->buffer_ptr)._M_elems[1]);
      if (fct_opt.super__Optional_base<function_element_token,_true,_true>._M_payload.
          super__Optional_payload_base<function_element_token>._M_payload._16_1_ == '\0')
      goto LAB_00129d2e;
      iVar6 = problem_parser::get_or_assign_variable(p,value_00);
      value._M_str = (char *)fct_opt.super__Optional_base<function_element_token,_true,_true>.
                             _M_payload.super__Optional_payload_base<function_element_token>.
                             _M_payload._M_value.name._M_len;
      value._M_len = (size_t)fct_opt.super__Optional_base<function_element_token,_true,_true>.
                             _M_payload.super__Optional_payload_base<function_element_token>.
                             _M_payload._M_value.factor;
      iVar7 = problem_parser::get_or_assign_variable(p,value);
      if ((iVar6 == -1) || (iVar7 == -1)) goto LAB_00129d26;
      poVar2 = (p->m_problem).objective.qelements.
               super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __it._M_current =
           (p->m_problem).objective.qelements.
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_70 = CONCAT44(iVar7,iVar6);
      lVar12 = (long)poVar2 - (long)__it._M_current;
      for (lVar13 = lVar12 >> 6; _Var10._M_current = __it._M_current, 0 < lVar13;
          lVar13 = lVar13 + -1) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::$_0>::
                operator()((_Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::__0>
                            *)&local_70,__it);
        if (bVar5) goto LAB_00129b13;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::$_0>::
                operator()((_Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::__0>
                            *)&local_70,__it._M_current + 1);
        _Var10._M_current = __it._M_current + 1;
        if (bVar5) goto LAB_00129b13;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::$_0>::
                operator()((_Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::__0>
                            *)&local_70,__it._M_current + 2);
        _Var10._M_current = __it._M_current + 2;
        if (bVar5) goto LAB_00129b13;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::$_0>::
                operator()((_Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::__0>
                            *)&local_70,__it._M_current + 3);
        _Var10._M_current = __it._M_current + 3;
        if (bVar5) goto LAB_00129b13;
        __it._M_current = __it._M_current + 4;
        lVar12 = lVar12 + -0x40;
      }
      lVar12 = lVar12 >> 4;
      if (lVar12 == 1) {
LAB_00129c9a:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::$_0>::
                operator()((_Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::__0>
                            *)&local_70,__it);
        _Var10._M_current = __it._M_current;
        if (!bVar5) {
          _Var10._M_current = poVar2;
        }
LAB_00129b13:
        if (_Var10._M_current == poVar2) goto LAB_00129bfd;
        (_Var10._M_current)->factor =
             (double)uVar4 * sign_factor * 0.5 + (_Var10._M_current)->factor;
      }
      else {
        if (lVar12 == 2) {
LAB_00129c7d:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::$_0>::
                  operator()((_Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::__0>
                              *)&local_70,__it);
          _Var10._M_current = __it._M_current;
          if (!bVar5) {
            __it._M_current = __it._M_current + 1;
            goto LAB_00129c9a;
          }
          goto LAB_00129b13;
        }
        if (lVar12 == 3) {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::$_0>::
                  operator()((_Iter_pred<read_quadratic_element(stream_buffer&,problem_parser&,double)::__0>
                              *)&local_70,__it);
          if (!bVar5) {
            __it._M_current = __it._M_current + 1;
            goto LAB_00129c7d;
          }
          goto LAB_00129b13;
        }
LAB_00129bfd:
        pvVar8 = std::
                 vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ::emplace_back<>(this);
        pvVar8->factor = (double)uVar4 * sign_factor * 0.5;
        pvVar8->variable_index_a = iVar6;
        pvVar8->variable_index_b = iVar7;
      }
      stream_buffer::pop_front(buf,2);
    }
    stream_buffer::pop_front(buf);
    __y_06._M_str = "/";
    __y_06._M_len = 1;
    bVar5 = std::operator==((buf->buffer_ptr)._M_elems[0],__y_06);
    if ((bVar5) &&
       (__y_07._M_str = "2", __y_07._M_len = 1,
       bVar5 = std::operator==((buf->buffer_ptr)._M_elems[1],__y_07), bVar5)) {
      iVar6 = 2;
    }
    else {
      __y_08._M_str = "/2";
      __y_08._M_len = 2;
      bVar5 = std::operator==((buf->buffer_ptr)._M_elems[0],__y_08);
      if (!bVar5) goto LAB_00129d2e;
      iVar6 = 1;
    }
    stream_buffer::pop_front(buf,iVar6);
    local_98 = 0;
  }
LAB_00129d2e:
  rVar14.column = 0;
  rVar14.tag = (undefined4)local_98;
  rVar14.line = local_98._4_4_;
  return rVar14;
LAB_001299be:
  __y_02._M_str = "^";
  __y_02._M_len = 1;
  bVar5 = std::operator==((buf->buffer_ptr)._M_elems[0],__y_02);
  if ((!bVar5) &&
     (__y_03._M_str = "^2", __y_03._M_len = 2,
     bVar5 = std::operator==((buf->buffer_ptr)._M_elems[0],__y_03), !bVar5)) goto LAB_00129817;
  __y_04._M_str = "^";
  __y_04._M_len = 1;
  bVar5 = std::operator==((buf->buffer_ptr)._M_elems[0],__y_04);
  if (bVar5) {
    __y_05._M_str = "2";
    __y_05._M_len = 1;
    bVar5 = std::operator==((buf->buffer_ptr)._M_elems[1],__y_05);
    iVar6 = 2;
    if (!bVar5) goto LAB_00129a2e;
  }
  else {
LAB_00129a2e:
    iVar6 = 1;
  }
  stream_buffer::pop_front(buf,iVar6);
  iVar6 = problem_parser::get_or_assign_variable(p,value_01);
  if (iVar6 == -1) {
LAB_00129d26:
    local_98 = 0xb;
    goto LAB_00129d2e;
  }
  poVar3 = (p->m_problem).objective.qelements.
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar9 = (p->m_problem).objective.qelements.
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)poVar3 - (long)poVar9;
  poVar9 = poVar9 + 2;
  for (lVar13 = lVar12 >> 6; 0 < lVar13; lVar13 = lVar13 + -1) {
    if ((poVar9[-2].variable_index_a == iVar6) && (poVar9[-2].variable_index_b == iVar6)) {
      poVar11 = poVar9 + -2;
      goto LAB_00129b83;
    }
    if ((poVar9[-1].variable_index_a == iVar6) && (poVar9[-1].variable_index_b == iVar6)) {
      poVar11 = poVar9 + -1;
      goto LAB_00129b83;
    }
    if ((poVar9->variable_index_a == iVar6) && (poVar11 = poVar9, poVar9->variable_index_b == iVar6)
       ) goto LAB_00129b83;
    if ((poVar9[1].variable_index_a == iVar6) && (poVar9[1].variable_index_b == iVar6)) {
      poVar11 = poVar9 + 1;
      goto LAB_00129b83;
    }
    poVar9 = poVar9 + 4;
    lVar12 = lVar12 + -0x40;
  }
  lVar12 = lVar12 >> 4;
  poVar11 = poVar9 + -2;
  if (lVar12 == 1) {
LAB_00129c62:
    if (iVar6 != poVar11->variable_index_b || poVar11->variable_index_a != iVar6) {
      poVar11 = poVar3;
    }
  }
  else if (lVar12 == 3) {
    if ((poVar9[-2].variable_index_a != iVar6) || (poVar9[-2].variable_index_b != iVar6)) {
      poVar11 = poVar9 + -1;
      goto LAB_00129c4e;
    }
  }
  else {
    if (lVar12 != 2) goto LAB_00129ba9;
LAB_00129c4e:
    if ((poVar11->variable_index_a != iVar6) || (poVar11->variable_index_b != iVar6)) {
      poVar11 = poVar11 + 1;
      goto LAB_00129c62;
    }
  }
LAB_00129b83:
  if (poVar11 != poVar3) {
    poVar11->factor = (double)uVar4 * sign_factor * 0.5 + poVar11->factor;
    goto LAB_00129817;
  }
LAB_00129ba9:
  pvVar8 = std::
           vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ::emplace_back<>(this);
  pvVar8->factor = (double)uVar4 * sign_factor * 0.5;
  pvVar8->variable_index_a = iVar6;
  pvVar8->variable_index_b = iVar6;
  goto LAB_00129817;
}

Assistant:

raw_problem_status
read_quadratic_element(stream_buffer& buf,
                       problem_parser& p,
                       double sign_factor) noexcept
{
    if (buf.first() != "[")
        return baryonyx::file_format_error_tag::bad_objective_quadratic;

    buf.pop_front();

    while (!buf.first().empty() && buf.first() != "]") {
        function_element_token fct;

        if (auto fct_opt =
              read_quadratic_element(buf.first(), buf.second(), buf.third());
            !fct_opt)
            return baryonyx::file_format_error_tag::bad_objective_quadratic;
        else
            fct = *fct_opt;

        buf.pop_front(fct.read);

        if (buf.first() == "*") {
            auto name_opt = read_name(buf.second());
            if (!name_opt.has_value())
                return baryonyx::file_format_error_tag::
                  bad_objective_quadratic;

            auto id1 = p.get_or_assign_variable(fct.name);
            auto id2 = p.get_or_assign_variable(*name_opt);

            if (id1 == -1 || id2 == -1)
                return baryonyx::file_format_error_tag::too_many_variables;

            auto it = std::find_if(p.m_problem.objective.qelements.begin(),
                                   p.m_problem.objective.qelements.end(),
                                   [id1, id2](const auto& elem) {
                                       return (elem.variable_index_a == id1 &&
                                               elem.variable_index_b == id2) ||
                                              (elem.variable_index_a == id2 &&
                                               elem.variable_index_b == id1);
                                   });
            if (it == p.m_problem.objective.qelements.end()) {
                auto& ret = p.m_problem.objective.qelements.emplace_back();
                ret.factor = fct.factor * sign_factor / 2.0;
                ret.variable_index_a = id1;
                ret.variable_index_b = id2;
            } else {
                it->factor += fct.factor * sign_factor / 2.0;
            }

            buf.pop_front(2);
        } else if (buf.first() == "^" || buf.first() == "^2") {
            if (buf.first() == "^" && buf.second() == "2")
                buf.pop_front(2);
            else
                buf.pop_front(1);

            auto id = p.get_or_assign_variable(fct.name);
            if (id == -1)
                return baryonyx::file_format_error_tag::too_many_variables;

            auto it = std::find_if(p.m_problem.objective.qelements.begin(),
                                   p.m_problem.objective.qelements.end(),
                                   [id](const auto& elem) {
                                       return elem.variable_index_a == id &&
                                              elem.variable_index_b == id;
                                   });

            if (it == p.m_problem.objective.qelements.end()) {
                auto& ret = p.m_problem.objective.qelements.emplace_back();
                ret.factor = fct.factor * sign_factor / 2.0;
                ret.variable_index_a = id;
                ret.variable_index_b = id;
            } else {
                it->factor += fct.factor * sign_factor / 2.0;
            }
        }
    }

    buf.pop_front();

    if (buf.first() == "/" && buf.second() == "2")
        buf.pop_front(2);
    else if (buf.first() == "/2")
        buf.pop_front(1);
    else
        return baryonyx::file_format_error_tag::bad_objective_quadratic;

    return baryonyx::file_format_error_tag::success;
}